

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPathCommand.cxx
# Opt level: O1

string * __thiscall
cmFindPathCommand::FindNormalHeader_abi_cxx11_
          (string *__return_storage_ptr__,cmFindPathCommand *this)

{
  pointer pbVar1;
  pointer pcVar2;
  bool bVar3;
  string *sp;
  pointer pbVar4;
  string *n;
  pointer pbVar5;
  string tryPath;
  string local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_48;
  cmFindPathCommand *local_40;
  pointer local_38;
  
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  local_68._M_string_length = 0;
  local_68.field_2._M_local_buf[0] = '\0';
  pbVar5 = (this->super_cmFindBase).Names.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_38 = (this->super_cmFindBase).Names.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  local_40 = this;
  if (pbVar5 != local_38) {
    local_48 = &__return_storage_ptr__->field_2;
    do {
      pbVar1 = (local_40->super_cmFindBase).super_cmFindCommon.SearchPaths.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (pbVar4 = (local_40->super_cmFindBase).super_cmFindCommon.SearchPaths.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; pbVar4 != pbVar1; pbVar4 = pbVar4 + 1
          ) {
        std::__cxx11::string::_M_assign((string *)&local_68);
        std::__cxx11::string::_M_append((char *)&local_68,(ulong)(pbVar5->_M_dataplus)._M_p);
        bVar3 = cmsys::SystemTools::FileExists(&local_68);
        if (bVar3) {
          if ((local_40->super_cmFindBase).field_0x222 == '\x01') {
            (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_48;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_68._M_dataplus._M_p == &local_68.field_2) {
              local_48->_M_allocated_capacity =
                   CONCAT71(local_68.field_2._M_allocated_capacity._1_7_,
                            local_68.field_2._M_local_buf[0]);
              *(undefined8 *)((long)local_48 + 8) = local_68.field_2._8_8_;
            }
            else {
              (__return_storage_ptr__->_M_dataplus)._M_p = local_68._M_dataplus._M_p;
              (__return_storage_ptr__->field_2)._M_allocated_capacity =
                   CONCAT71(local_68.field_2._M_allocated_capacity._1_7_,
                            local_68.field_2._M_local_buf[0]);
            }
            __return_storage_ptr__->_M_string_length = local_68._M_string_length;
            local_68._M_string_length = 0;
            local_68.field_2._M_local_buf[0] = '\0';
            local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
          }
          else {
            (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_48;
            pcVar2 = (pbVar4->_M_dataplus)._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)__return_storage_ptr__,pcVar2,pcVar2 + pbVar4->_M_string_length);
          }
          if (bVar3) goto LAB_0020c7b8;
        }
      }
      pbVar5 = pbVar5 + 1;
    } while (pbVar5 != local_38);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
LAB_0020c7b8:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,
                    CONCAT71(local_68.field_2._M_allocated_capacity._1_7_,
                             local_68.field_2._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmFindPathCommand::FindNormalHeader()
{
  std::string tryPath;
  for (std::string const& n : this->Names) {
    for (std::string const& sp : this->SearchPaths) {
      tryPath = sp;
      tryPath += n;
      if (cmSystemTools::FileExists(tryPath)) {
        if (this->IncludeFileInPath) {
          return tryPath;
        }
        return sp;
      }
    }
  }
  return "";
}